

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O3

void __thiscall HuffmanEncoder::build(HuffmanEncoder *this,shared_ptr<HuffmanNode> *root)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar4;
  bool bVar5;
  shared_ptr<HuffmanNode> local_40;
  long local_30;
  
  peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (peVar2 != (element_type *)0x0) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    build(this,&local_40);
    if (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (peVar2 != (element_type *)0x0) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    build(this,&local_40);
    if (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (peVar2 == (element_type *)0x0) {
    peVar1 = (root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar2 = (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (peVar1->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar5 = peVar2 == (element_type *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      bVar5 = peVar2 == (element_type *)0x0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    bVar5 = false;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (bVar5) {
    local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT71(local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                  ((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->c_);
    pmVar4 = std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->table_,(key_type *)&local_40);
    std::__cxx11::string::_M_assign((string *)pmVar4);
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)&this->temp_code_);
  std::__cxx11::string::operator=((string *)&this->temp_code_,(string *)&local_40);
  if (local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)&local_30) {
    operator_delete(local_40.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_30 + 1);
  }
  return;
}

Assistant:

void HuffmanEncoder::build(const shared_ptr<HuffmanNode>& root) {
  if (root->get_left() != nullptr) {
    temp_code_.append("0");
    build(root->get_left());
  }

  if (root->get_right() != nullptr) {
    temp_code_.append("1");
    build(root->get_right());
  }

  if (root->get_right() == nullptr &&
    root->get_left() == nullptr) {
    table_[root->get_c()] = temp_code_;
  }

  temp_code_ = temp_code_.substr(0, temp_code_.size() - 1);
}